

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeConstraint::updateHeightRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  
  ShapeRange::intersect((ShapeRange *)&err,&this->_heightRange,other);
  *(size_type *)&(this->_heightRange)._maximum = err.field_2._M_allocated_capacity;
  (this->_heightRange)._maximum._val = err.field_2._8_8_;
  *(pointer *)&(this->_heightRange)._minimum = err._M_dataplus._M_p;
  (this->_heightRange)._minimum._val = err._M_string_length;
  return;
}

Assistant:

void ShapeConstraint::updateHeightRange(const ShapeRange& other) {
    try {
        _heightRange = _heightRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid height range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}